

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O0

from_chars_result_t<char>
fast_float::from_chars_advanced<float,char>
          (char *first,char *last,float *value,parse_options_t<char> options)

{
  char cVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [8];
  int64_t iVar24;
  undefined8 uVar25;
  size_t sVar26;
  char *pcVar27;
  undefined1 auVar28 [8];
  bool bVar29;
  bool bVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  difference_type dVar36;
  char *pcVar37;
  size_t sVar38;
  long lVar39;
  uint64_t uVar40;
  ulong uVar41;
  ulong uVar42;
  byte bVar43;
  float fVar44;
  float fVar45;
  from_chars_result_t<char> fVar46;
  adjusted_mantissa aVar47;
  float local_5f4;
  float local_5cc;
  adjusted_mantissa local_510;
  ulong local_500;
  uint local_4f8;
  undefined1 auStack_4f0 [8];
  adjusted_mantissa am;
  undefined1 local_4d8 [8];
  parsed_number_string_t<char> pns;
  from_chars_result_t<char> answer;
  float *value_local;
  char *last_local;
  char *first_local;
  parse_options_t<char> options_local;
  errc local_460;
  char *frac_end;
  uint64_t minimal_nineteen_digit_integer;
  char *int_end;
  char *start;
  uint8_t digit_1;
  bool neg_exp;
  char *location_of_e;
  int64_t exp_number;
  char *local_418;
  byte local_409;
  char *pcStack_408;
  uint8_t digit;
  char *before;
  int64_t exponent;
  char *local_3f0;
  size_t local_3e8;
  int64_t digit_count;
  char *end_of_integer_part;
  uint64_t i;
  char *start_digits;
  char decimal_point;
  char *pcStack_3c0;
  chars_format fmt;
  char *local_3b8;
  parse_options_t<char> local_3ac;
  float local_3a4;
  char local_39d;
  float fmini;
  char **local_398;
  char *local_390;
  char **local_388;
  long local_380;
  long local_378;
  uint64_t val;
  long local_368;
  uint64_t val_1;
  undefined8 local_358;
  uint64_t mul2;
  uint64_t mul1;
  uint64_t mask;
  int local_334;
  ulong uStack_330;
  int upperbit_1;
  value128 product_1;
  int lz_1;
  undefined1 local_308 [8];
  adjusted_mantissa answer_5;
  int upperbit;
  value128 product;
  int lz;
  undefined1 local_2c0 [8];
  adjusted_mantissa answer_2;
  value128 product_2;
  int lz_2;
  fastfloat_uint_conflict word;
  value128 secondproduct_2;
  uint64_t precision_mask_2;
  int index_2;
  int local_200;
  value128 firstproduct_2;
  __uint128_t r_5;
  undefined1 local_1c8 [8];
  value128 answer_9;
  __uint128_t r_4;
  undefined1 local_198 [8];
  value128 answer_8;
  value128 secondproduct;
  uint64_t precision_mask;
  int index;
  int local_160;
  ulong local_158;
  value128 firstproduct;
  __uint128_t r_1;
  undefined1 local_128 [8];
  value128 answer_4;
  __uint128_t r;
  undefined1 local_f8 [8];
  value128 answer_3;
  value128 secondproduct_1;
  uint64_t precision_mask_1;
  int index_1;
  int local_c0;
  ulong local_b8;
  value128 firstproduct_1;
  __uint128_t r_3;
  undefined1 local_88 [8];
  value128 answer_7;
  __uint128_t r_2;
  undefined1 local_50 [8];
  value128 answer_6;
  sbyte local_38;
  int bias;
  int hilz;
  undefined1 local_20 [8];
  adjusted_mantissa answer_10;
  
  if (first == last) {
    local_460 = invalid_argument;
    options_local = (parse_options_t<char>)first;
    goto LAB_0067f18f;
  }
  local_3ac.format = options.format;
  start_digits._4_4_ = local_3ac.format;
  local_3ac.decimal_point = options.decimal_point;
  start_digits._3_1_ = local_3ac.decimal_point;
  am._8_8_ = options;
  pcStack_3c0 = last;
  local_3b8 = first;
  local_3ac = options;
  parsed_number_string_t<char>::parsed_number_string_t((parsed_number_string_t<char> *)local_4d8);
  pns.lastmatch._1_1_ = 0;
  pns.lastmatch._2_1_ = 0;
  pns.lastmatch._0_1_ = *local_3b8 == '-';
  if ((*local_3b8 != '-') ||
     ((local_3b8 = local_3b8 + 1, pcVar37 = local_3b8, local_3b8 != pcStack_3c0 &&
      ((local_39d = *local_3b8, local_39d < ':' && '/' < local_39d ||
       (*local_3b8 == start_digits._3_1_)))))) {
    pcVar37 = local_3b8;
    i = (uint64_t)local_3b8;
    end_of_integer_part = (char *)0x0;
    while( true ) {
      bVar30 = false;
      if (local_3b8 != pcStack_3c0) {
        fmini._0_1_ = *local_3b8;
        bVar30 = fmini._0_1_ < ':' && '/' < fmini._0_1_;
      }
      if (!bVar30) break;
      end_of_integer_part = (char *)((long)end_of_integer_part * 10 + (long)(*local_3b8 + -0x30));
      local_3b8 = local_3b8 + 1;
    }
    digit_count = (int64_t)local_3b8;
    local_3e8 = (long)local_3b8 - (long)pcVar37;
    span<const_char>::span((span<const_char> *)&exponent,pcVar37,local_3e8);
    pns.negative = (bool)(undefined1)exponent;
    pns.valid = (bool)exponent._1_1_;
    pns.too_many_digits = (bool)exponent._2_1_;
    pns._27_5_ = exponent._3_5_;
    pns.integer.ptr = local_3f0;
    before = (char *)0x0;
    if ((local_3b8 != pcStack_3c0) && (*local_3b8 == start_digits._3_1_)) {
      pcStack_408 = local_3b8 + 1;
      local_388 = &local_3b8;
      local_390 = pcStack_3c0;
      local_398 = &end_of_integer_part;
      local_3b8 = pcStack_408;
      while( true ) {
        dVar36 = std::distance<char_const*>(*local_388,local_390);
        bVar30 = false;
        if (7 < dVar36) {
          val = (uint64_t)*local_388;
          local_380 = *(long *)val;
          bVar30 = ((local_380 + 0x4646464646464646U | local_380 + 0xcfcfcfcfcfcfcfd0U) &
                   0x8080808080808080) == 0;
          local_378 = local_380;
        }
        if (!bVar30) break;
        val_1 = (uint64_t)*local_388;
        local_368 = *(long *)val_1;
        mul1 = 0xff000000ff;
        mul2 = 0xf424000000064;
        local_358 = 0x271000000001;
        uVar41 = (local_368 + 0xcfcfcfcfcfcfcfd0U) * 10 + (local_368 + 0xcfcfcfcfcfcfcfd0U >> 8);
        mask = (uVar41 & 0xff000000ff) * 0xf424000000064 +
               (uVar41 >> 0x10 & 0xff000000ff) * 0x271000000001 >> 0x20;
        *local_398 = (char *)((long)*local_398 * 100000000 + mask);
        *local_388 = *local_388 + 8;
      }
      while( true ) {
        bVar30 = false;
        if (local_3b8 != pcStack_3c0) {
          fmini._1_1_ = *local_3b8;
          bVar30 = fmini._1_1_ < ':' && '/' < fmini._1_1_;
        }
        if (!bVar30) break;
        local_409 = *local_3b8 - 0x30;
        local_3b8 = local_3b8 + 1;
        end_of_integer_part = (char *)((long)end_of_integer_part * 10 + (ulong)local_409);
      }
      before = pcStack_408 + -(long)local_3b8;
      span<const_char>::span
                ((span<const_char> *)&exp_number,pcStack_408,(long)local_3b8 - (long)pcStack_408);
      pns.integer.length = exp_number;
      pns.fraction.ptr = local_418;
      local_3e8 = local_3e8 - (long)before;
    }
    pcVar27 = local_3b8;
    uVar25 = pns._24_8_;
    pcVar37 = local_3b8;
    if (local_3e8 != 0) {
      location_of_e = (char *)0x0;
      if ((((start_digits._4_4_ & scientific) == 0) || (local_3b8 == pcStack_3c0)) ||
         ((*local_3b8 != 'e' && (*local_3b8 != 'E')))) {
        local_3b8 = pcVar27;
        if ((start_digits._4_4_ & scientific) != 0) goto joined_r0x0067da13;
      }
      else {
        pcVar37 = local_3b8 + 1;
        bVar30 = false;
        if ((pcVar37 == pcStack_3c0) || (*pcVar37 != '-')) {
          if ((pcVar37 != pcStack_3c0) && (*pcVar37 == '+')) {
            pcVar37 = local_3b8 + 2;
          }
        }
        else {
          bVar30 = true;
          pcVar37 = local_3b8 + 2;
        }
        local_3b8 = pcVar37;
        pcVar37 = local_3b8;
        if ((local_3b8 == pcStack_3c0) ||
           (fmini._3_1_ = *local_3b8, '9' < fmini._3_1_ || fmini._3_1_ < '0')) {
joined_r0x0067da13:
          local_3b8 = pcVar27;
          if ((start_digits._4_4_ & fixed) == 0) goto LAB_0067dcf7;
        }
        else {
          while( true ) {
            bVar29 = false;
            if (local_3b8 != pcStack_3c0) {
              fmini._2_1_ = *local_3b8;
              bVar29 = fmini._2_1_ < ':' && '/' < fmini._2_1_;
            }
            if (!bVar29) break;
            if ((long)location_of_e < 0x10000000) {
              location_of_e = (char *)((long)location_of_e * 10 + (ulong)(byte)(*local_3b8 - 0x30));
            }
            local_3b8 = local_3b8 + 1;
          }
          if (bVar30) {
            location_of_e = (char *)-(long)location_of_e;
          }
          before = location_of_e + (long)before;
        }
      }
      pns.mantissa = (uint64_t)local_3b8;
      pns.lastmatch._1_1_ = 1;
      if (0x13 < (long)local_3e8) {
        int_end = (char *)i;
        while( true ) {
          bVar30 = false;
          if ((int_end != pcStack_3c0) && (bVar30 = true, *int_end != '0')) {
            bVar30 = *int_end == start_digits._3_1_;
          }
          if (!bVar30) break;
          if (*int_end == '0') {
            local_3e8 = local_3e8 - 1;
          }
          int_end = int_end + 1;
        }
        if (0x13 < (long)local_3e8) {
          pns.lastmatch._2_1_ = 1;
          end_of_integer_part = (char *)0x0;
          local_3b8 = (char *)pns._24_8_;
          sVar38 = span<const_char>::len((span<const_char> *)&pns.negative);
          sVar26 = pns.integer.length;
          for (; end_of_integer_part < (char *)0xde0b6b3a7640000 &&
                 local_3b8 != (char *)(uVar25 + sVar38);
              end_of_integer_part = (char *)((long)end_of_integer_part * 10 + (long)(cVar1 + -0x30))
              ) {
            cVar1 = *local_3b8;
            local_3b8 = local_3b8 + 1;
          }
          if (end_of_integer_part < (char *)0xde0b6b3a7640000) {
            local_3b8 = (char *)pns.integer.length;
            sVar38 = span<const_char>::len((span<const_char> *)&pns.integer.length);
            for (; end_of_integer_part < (char *)0xde0b6b3a7640000 &&
                   local_3b8 != (char *)(sVar26 + sVar38);
                end_of_integer_part =
                     (char *)((long)end_of_integer_part * 10 + (long)(cVar1 + -0x30))) {
              cVar1 = *local_3b8;
              local_3b8 = local_3b8 + 1;
            }
            lVar39 = pns.integer.length - (long)local_3b8;
          }
          else {
            lVar39 = digit_count - (long)local_3b8;
          }
          before = location_of_e + lVar39;
        }
      }
      local_4d8 = (undefined1  [8])before;
      pns.exponent = (int64_t)end_of_integer_part;
      pcVar37 = local_3b8;
    }
  }
LAB_0067dcf7:
  local_3b8 = pcVar37;
  if ((pns.lastmatch._1_1_ & 1) == 0) {
    fVar46 = detail::parse_infnan<float,char>(first,last,value);
    options_local = (parse_options_t<char>)fVar46.ptr;
    local_460 = fVar46.ec;
    goto LAB_0067f18f;
  }
  answer.ptr._0_4_ = 0;
  pns.fraction.length = pns.mantissa;
  iVar31 = binary_format<float>::min_exponent_fast_path();
  auVar23 = local_4d8;
  if ((((long)iVar31 <= (long)local_4d8) &&
      (iVar31 = binary_format<float>::max_exponent_fast_path(), iVar24 = pns.exponent,
      (long)auVar23 <= (long)iVar31)) && ((pns.lastmatch._2_1_ & 1) == 0)) {
    local_3a4 = detail::rounds_to_nearest()::fmin;
    if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
       (NAN(detail::rounds_to_nearest()::fmin + 1.0) || NAN(1.0 - detail::rounds_to_nearest()::fmin)
       )) {
      if ((-1 < (long)local_4d8) &&
         (uVar40 = binary_format<float>::max_mantissa_fast_path((int64_t)local_4d8),
         (ulong)iVar24 <= uVar40)) {
        if (pns.exponent == 0) {
          fVar45 = -0.0;
          if (((byte)pns.lastmatch & 1) == 0) {
            fVar45 = 0.0;
          }
          *value = fVar45;
          options_local.format = (undefined4)pns.fraction.length;
          options_local.decimal_point = pns.fraction.length._4_1_;
          options_local._5_3_ = pns.fraction.length._5_3_;
          local_460 = 0;
        }
        else {
          local_5f4 = (float)(ulong)pns.exponent;
          fVar45 = binary_format<float>::exact_power_of_ten((int64_t)local_4d8);
          *value = local_5f4 * fVar45;
          if (((byte)pns.lastmatch & 1) != 0) {
            *value = -*value;
          }
          options_local.format = (undefined4)pns.fraction.length;
          options_local.decimal_point = pns.fraction.length._4_1_;
          options_local._5_3_ = pns.fraction.length._5_3_;
          local_460 = 0;
        }
        goto LAB_0067f18f;
      }
    }
    else {
      uVar40 = binary_format<float>::max_mantissa_fast_path();
      if ((ulong)iVar24 <= uVar40) {
        local_5cc = (float)(ulong)pns.exponent;
        *value = local_5cc;
        if ((long)local_4d8 < 0) {
          fVar45 = *value;
          fVar44 = binary_format<float>::exact_power_of_ten(-(long)local_4d8);
          *value = fVar45 / fVar44;
        }
        else {
          fVar45 = *value;
          fVar44 = binary_format<float>::exact_power_of_ten((int64_t)local_4d8);
          *value = fVar45 * fVar44;
        }
        if (((byte)pns.lastmatch & 1) != 0) {
          *value = -*value;
        }
        options_local.format = (undefined4)pns.fraction.length;
        options_local.decimal_point = pns.fraction.length._4_1_;
        options_local._5_3_ = pns.fraction.length._5_3_;
        local_460 = 0;
        goto LAB_0067f18f;
      }
    }
  }
  iVar24 = pns.exponent;
  auVar23 = local_4d8;
  adjusted_mantissa::adjusted_mantissa((adjusted_mantissa *)local_2c0);
  if ((iVar24 == 0) ||
     (iVar31 = binary_format<float>::smallest_power_of_ten(), (long)auVar23 < (long)iVar31)) {
    answer_2.mantissa._0_4_ = 0;
    local_2c0 = (undefined1  [8])0x0;
  }
  else {
    iVar31 = binary_format<float>::largest_power_of_ten();
    if ((long)iVar31 < (long)auVar23) {
      answer_2.mantissa._0_4_ = binary_format<float>::infinite_power();
      local_2c0 = (undefined1  [8])0x0;
    }
    else {
      answer_2._8_8_ = iVar24;
      if (iVar24 == 0) {
        __assert_fail("input_num > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                      ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
      }
      lVar39 = 0x3f;
      if (iVar24 != 0) {
        for (; (ulong)iVar24 >> lVar39 == 0; lVar39 = lVar39 + -1) {
        }
      }
      uVar35 = (uint)lVar39 ^ 0x3f;
      product.high._4_1_ = (byte)uVar35;
      uVar42 = iVar24 << (product.high._4_1_ & 0x3f);
      local_160 = auVar23._0_4_;
      iVar31 = local_160 * 2 + 0x2ac;
      uVar41 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8);
      value128::value128((value128 *)local_f8);
      auVar15._8_8_ = answer_4.low;
      auVar15._0_8_ = local_128;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar42;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar41;
      unique0x00053e00 = auVar3 * auVar9;
      uVar40 = answer_4.high;
      local_f8 = (undefined1  [8])answer_4.high;
      uVar41 = (ulong)r;
      answer_3.low = (ulong)r;
      firstproduct.low = (ulong)r;
      auVar18 = unique0x00053e00;
      auVar21 = unique0x00053e00;
      if (((ulong)r & 0x3fffffffff) == 0x3fffffffff) {
        uVar2 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8 + 8);
        value128::value128((value128 *)local_128);
        auVar18._8_8_ = answer_3.low;
        auVar18._0_8_ = local_f8;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar42;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar2;
        auVar15 = auVar4 * auVar10;
        firstproduct.high = auVar15._0_8_;
        r_1._0_8_ = auVar15._8_8_;
        answer_8.high = firstproduct.high;
        if ((ulong)r_1 + uVar40 < (ulong)r_1) {
          firstproduct.low = uVar41 + 1;
        }
        auVar21._8_8_ = firstproduct.low;
        auVar21._0_8_ = (ulong)r_1 + uVar40;
      }
      firstproduct.low = auVar21._8_8_;
      local_158 = auVar21._0_8_;
      answer_4.low = auVar15._8_8_;
      local_128 = auVar15._0_8_;
      answer_3.low = auVar18._8_8_;
      local_f8 = auVar18._0_8_;
      iVar31 = -(auVar21._12_4_ >> 0x1f);
      cVar1 = (char)iVar31;
      iVar34 = binary_format<float>::mantissa_explicit_bits();
      local_2c0 = (undefined1  [8])(firstproduct.low >> ((cVar1 - (char)iVar34) + 0x3dU & 0x3f));
      iVar34 = binary_format<float>::minimum_exponent();
      answer_2.mantissa._0_4_ = (((local_160 * 0x3526a >> 0x10) + 0x3f + iVar31) - uVar35) - iVar34;
      if ((int)(uint)answer_2.mantissa < 1) {
        if ((int)(1 - (uint)answer_2.mantissa) < 0x40) {
          uVar41 = (ulong)local_2c0 >> (1U - (char)(uint)answer_2.mantissa & 0x3f);
          uVar41 = (uVar41 & 1) + uVar41 >> 1;
          local_2c0 = (undefined1  [8])uVar41;
          iVar31 = binary_format<float>::mantissa_explicit_bits();
          answer_2.mantissa._0_4_ = (uint)((ulong)(1L << ((byte)iVar31 & 0x3f)) <= uVar41);
        }
        else {
          answer_2.mantissa._0_4_ = 0;
          local_2c0 = (undefined1  [8])0x0;
        }
      }
      else {
        if ((((local_158 < 2) &&
             (iVar31 = binary_format<float>::min_exponent_round_to_even(),
             (long)iVar31 <= (long)auVar23)) &&
            (iVar31 = binary_format<float>::max_exponent_round_to_even(), auVar28 = local_2c0,
            (long)auVar23 <= (long)iVar31)) &&
           ((((ulong)local_2c0 & 3) == 1 &&
            (iVar31 = binary_format<float>::mantissa_explicit_bits(),
            (long)auVar28 << ((cVar1 - (char)iVar31) + 0x3dU & 0x3f) == firstproduct.low)))) {
          local_2c0 = (undefined1  [8])((ulong)local_2c0 & 0xfffffffffffffffe);
        }
        uVar41 = ((ulong)local_2c0 & 1) + (long)local_2c0 >> 1;
        local_2c0 = (undefined1  [8])uVar41;
        iVar31 = binary_format<float>::mantissa_explicit_bits();
        if ((ulong)(2L << ((byte)iVar31 & 0x3f)) <= uVar41) {
          iVar31 = binary_format<float>::mantissa_explicit_bits();
          local_2c0 = (undefined1  [8])(1L << ((byte)iVar31 & 0x3f));
          answer_2.mantissa._0_4_ = (uint)answer_2.mantissa + 1;
        }
        iVar31 = binary_format<float>::mantissa_explicit_bits();
        uVar35 = (uint)answer_2.mantissa;
        local_2c0 = (undefined1  [8])
                    ((1L << ((byte)iVar31 & 0x3f) ^ 0xffffffffffffffffU) & (ulong)local_2c0);
        iVar31 = binary_format<float>::infinite_power();
        if (iVar31 <= (int)uVar35) {
          answer_2.mantissa._0_4_ = binary_format<float>::infinite_power();
          local_2c0 = (undefined1  [8])0x0;
        }
      }
    }
  }
  auVar23 = local_4d8;
  local_4f8 = (uint)answer_2.mantissa;
  local_500 = (ulong)local_2c0;
  auStack_4f0 = local_2c0;
  am.mantissa._0_4_ = (uint)answer_2.mantissa;
  if (((pns.lastmatch._2_1_ & 1) != 0) && (-1 < (int)(uint)answer_2.mantissa)) {
    uVar41 = pns.exponent + 1;
    adjusted_mantissa::adjusted_mantissa((adjusted_mantissa *)local_308);
    if ((uVar41 == 0) ||
       (iVar31 = binary_format<float>::smallest_power_of_ten(), (long)auVar23 < (long)iVar31)) {
      answer_5.mantissa._0_4_ = 0;
      local_308 = (undefined1  [8])0x0;
    }
    else {
      iVar31 = binary_format<float>::largest_power_of_ten();
      if ((long)iVar31 < (long)auVar23) {
        answer_5.mantissa._0_4_ = binary_format<float>::infinite_power();
        local_308 = (undefined1  [8])0x0;
      }
      else {
        answer_5._8_8_ = uVar41;
        if (uVar41 == 0) {
          __assert_fail("input_num > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                        ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
        }
        lVar39 = 0x3f;
        if (uVar41 != 0) {
          for (; uVar41 >> lVar39 == 0; lVar39 = lVar39 + -1) {
          }
        }
        product_1.high._4_4_ = (uint)lVar39 ^ 0x3f;
        uVar41 = uVar41 << (product_1.high._4_1_ & 0x3f);
        local_c0 = auVar23._0_4_;
        iVar31 = local_c0 * 2 + 0x2ac;
        uVar42 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8);
        value128::value128((value128 *)local_50);
        auVar16._8_8_ = answer_7.low;
        auVar16._0_8_ = local_88;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar41;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar42;
        unique0x00053e00 = auVar5 * auVar11;
        uVar40 = answer_7.high;
        local_50 = (undefined1  [8])answer_7.high;
        uVar42 = (ulong)r_2;
        answer_6.low = (ulong)r_2;
        firstproduct_1.low = (ulong)r_2;
        auVar19 = unique0x00053e00;
        auVar22 = unique0x00053e00;
        if (((ulong)r_2 & 0x3fffffffff) == 0x3fffffffff) {
          uVar2 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8 + 8);
          value128::value128((value128 *)local_88);
          auVar19._8_8_ = answer_6.low;
          auVar19._0_8_ = local_50;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar41;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar2;
          auVar16 = auVar6 * auVar12;
          firstproduct_1.high = auVar16._0_8_;
          r_3._0_8_ = auVar16._8_8_;
          answer_3.high = firstproduct_1.high;
          if ((ulong)r_3 + uVar40 < (ulong)r_3) {
            firstproduct_1.low = uVar42 + 1;
          }
          auVar22._8_8_ = firstproduct_1.low;
          auVar22._0_8_ = (ulong)r_3 + uVar40;
        }
        firstproduct_1.low = auVar22._8_8_;
        local_b8 = auVar22._0_8_;
        answer_7.low = auVar16._8_8_;
        local_88 = auVar16._0_8_;
        answer_6.low = auVar19._8_8_;
        local_50 = auVar19._0_8_;
        uStack_330 = local_b8;
        product_1.low = firstproduct_1.low;
        local_334 = -(auVar22._12_4_ >> 0x1f);
        cVar1 = (char)local_334;
        iVar31 = binary_format<float>::mantissa_explicit_bits();
        local_308 = (undefined1  [8])(firstproduct_1.low >> ((cVar1 - (char)iVar31) + 0x3dU & 0x3f))
        ;
        iVar31 = ((local_c0 * 0x3526a >> 0x10) + 0x3f + local_334) - product_1.high._4_4_;
        iVar34 = binary_format<float>::minimum_exponent();
        answer_5.mantissa._0_4_ = iVar31 - iVar34;
        if ((int)(uint)answer_5.mantissa < 1) {
          if ((int)(1 - (uint)answer_5.mantissa) < 0x40) {
            uVar41 = (ulong)local_308 >> (1U - (char)(uint)answer_5.mantissa & 0x3f);
            uVar41 = (uVar41 & 1) + uVar41 >> 1;
            local_308 = (undefined1  [8])uVar41;
            iVar31 = binary_format<float>::mantissa_explicit_bits();
            answer_5.mantissa._0_4_ = (uint)((ulong)(1L << ((byte)iVar31 & 0x3f)) <= uVar41);
          }
          else {
            answer_5.mantissa._0_4_ = 0;
            local_308 = (undefined1  [8])0x0;
          }
        }
        else {
          if ((((uStack_330 < 2) &&
               (iVar31 = binary_format<float>::min_exponent_round_to_even(),
               (long)iVar31 <= (long)auVar23)) &&
              (iVar31 = binary_format<float>::max_exponent_round_to_even(), auVar28 = local_308,
              (long)auVar23 <= (long)iVar31)) &&
             ((((ulong)local_308 & 3) == 1 &&
              (cVar1 = (char)local_334, iVar31 = binary_format<float>::mantissa_explicit_bits(),
              (long)auVar28 << ((cVar1 - (char)iVar31) + 0x3dU & 0x3f) == product_1.low)))) {
            local_308 = (undefined1  [8])((ulong)local_308 & 0xfffffffffffffffe);
          }
          uVar41 = ((ulong)local_308 & 1) + (long)local_308 >> 1;
          local_308 = (undefined1  [8])uVar41;
          iVar31 = binary_format<float>::mantissa_explicit_bits();
          if ((ulong)(2L << ((byte)iVar31 & 0x3f)) <= uVar41) {
            iVar31 = binary_format<float>::mantissa_explicit_bits();
            local_308 = (undefined1  [8])(1L << ((byte)iVar31 & 0x3f));
            answer_5.mantissa._0_4_ = (uint)answer_5.mantissa + 1;
          }
          iVar31 = binary_format<float>::mantissa_explicit_bits();
          uVar35 = (uint)answer_5.mantissa;
          local_308 = (undefined1  [8])
                      ((1L << ((byte)iVar31 & 0x3f) ^ 0xffffffffffffffffU) & (ulong)local_308);
          iVar31 = binary_format<float>::infinite_power();
          if (iVar31 <= (int)uVar35) {
            answer_5.mantissa._0_4_ = binary_format<float>::infinite_power();
            local_308 = (undefined1  [8])0x0;
          }
        }
      }
    }
    local_510.mantissa = (uint64_t)local_308;
    local_510.power2 = (uint)answer_5.mantissa;
    bVar30 = adjusted_mantissa::operator!=((adjusted_mantissa *)auStack_4f0,&local_510);
    if (bVar30) {
      if (pns.exponent == 0) {
        __assert_fail("input_num > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                      ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
      }
      lVar39 = 0x3f;
      if (pns.exponent != 0) {
        for (; (ulong)pns.exponent >> lVar39 == 0; lVar39 = lVar39 + -1) {
        }
      }
      uVar35 = (uint)lVar39 ^ 0x3f;
      product_2.high._4_1_ = (byte)uVar35;
      uVar42 = pns.exponent << (product_2.high._4_1_ & 0x3f);
      local_200 = local_4d8._0_4_;
      iVar31 = local_200 * 2 + 0x2ac;
      uVar41 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8);
      value128::value128((value128 *)local_198);
      auVar17._8_8_ = answer_9.low;
      auVar17._0_8_ = local_1c8;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar42;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar41;
      unique0x00053e00 = auVar7 * auVar13;
      uVar40 = answer_9.high;
      local_198 = (undefined1  [8])answer_9.high;
      uVar41 = (ulong)r_4;
      answer_8.low = (ulong)r_4;
      auVar20 = unique0x00053e00;
      if (((ulong)r_4 & 0x3fffffffff) == 0x3fffffffff) {
        uVar2 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8 + 8);
        value128::value128((value128 *)local_1c8);
        auVar20._8_8_ = answer_8.low;
        auVar20._0_8_ = local_198;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar42;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar2;
        auVar17 = auVar8 * auVar14;
        r_5._0_8_ = auVar17._8_8_;
        if ((ulong)r_5 + uVar40 < (ulong)r_5) {
          uVar41 = uVar41 + 1;
        }
      }
      answer_9.low = auVar17._8_8_;
      local_1c8 = auVar17._0_8_;
      answer_8.low = auVar20._8_8_;
      local_198 = auVar20._0_8_;
      uVar32 = (uint)(uVar41 >> 0x3f) ^ 1;
      adjusted_mantissa::adjusted_mantissa((adjusted_mantissa *)local_20);
      local_38 = (sbyte)uVar32;
      local_20 = (undefined1  [8])(uVar41 << local_38);
      iVar31 = binary_format<float>::mantissa_explicit_bits();
      iVar34 = binary_format<float>::minimum_exponent();
      answer_6.high._4_4_ = iVar31 - iVar34;
      answer_10._12_4_ = local_200;
      am.mantissa._0_4_ =
           ((((local_200 * 0x3526a >> 0x10) + answer_6.high._4_4_) - uVar32) - uVar35) - 0x7fff;
      auStack_4f0 = local_20;
      answer_10.mantissa._0_4_ = (uint)am.mantissa;
    }
  }
  if ((int)(uint)am.mantissa < 0) {
    aVar47.power2 = (uint)am.mantissa;
    aVar47.mantissa = (uint64_t)auStack_4f0;
    aVar47._12_4_ = 0;
    aVar47 = digit_comp<float,char>((parsed_number_string_t<char> *)local_4d8,aVar47);
    auStack_4f0 = (undefined1  [8])aVar47.mantissa;
    am.mantissa._0_4_ = aVar47.power2;
  }
  uVar35 = (uint)am.mantissa;
  bVar43 = (byte)pns.lastmatch & 1;
  uVar33 = auStack_4f0._0_4_;
  iVar31 = binary_format<float>::mantissa_explicit_bits();
  iVar34 = binary_format<float>::sign_index();
  uVar32 = (uint)am.mantissa;
  *value = (float)((uint)bVar43 << ((byte)iVar34 & 0x1f) | uVar35 << ((byte)iVar31 & 0x1f) | uVar33)
  ;
  if ((((pns.exponent != 0) && (auStack_4f0 == (undefined1  [8])0x0)) && ((uint)am.mantissa == 0))
     || (uVar35 = binary_format<float>::infinite_power(), uVar32 == uVar35)) {
    answer.ptr._0_4_ = result_out_of_range;
  }
  options_local.format = (undefined4)pns.fraction.length;
  options_local.decimal_point = pns.fraction.length._4_1_;
  options_local._5_3_ = pns.fraction.length._5_3_;
  local_460 = (errc)answer.ptr;
LAB_0067f18f:
  fVar46.ec = local_460;
  fVar46.ptr = (char *)options_local;
  fVar46._12_4_ = 0;
  return fVar46;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");
  static_assert (std::is_same<UC, char>::value ||
                 std::is_same<UC, wchar_t>::value ||
                 std::is_same<UC, char16_t>::value ||
                 std::is_same<UC, char32_t>::value , "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? -0. : 0.;
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}